

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrixIO.cpp
# Opt level: O0

string * ZXing::ToString_abi_cxx11_
                   (BitMatrix *matrix,char one,char zero,bool addSpace,bool printAsCString)

{
  int iVar1;
  uchar *puVar2;
  char in_CL;
  char in_DL;
  BitMatrix *in_RSI;
  string *in_RDI;
  byte in_R8B;
  byte in_R9B;
  Range<const_unsigned_char_*> RVar3;
  uchar bit;
  uchar *__end2;
  uchar *__begin2;
  Range<const_unsigned_char_*> *__range2;
  int y;
  string *result;
  char local_a1;
  uchar *in_stack_ffffffffffffff68;
  int iVar4;
  uchar *local_48;
  Range<const_unsigned_char_*> local_40;
  Range<const_unsigned_char_*> *local_30;
  int local_28;
  undefined1 local_15;
  byte local_14;
  byte local_13;
  char local_12;
  char local_11;
  BitMatrix *local_10;
  
  local_13 = in_R8B & 1;
  local_14 = in_R9B & 1;
  local_15 = 0;
  local_12 = in_CL;
  local_11 = in_DL;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  BitMatrix::width(local_10);
  BitMatrix::height(local_10);
  BitMatrix::height(local_10);
  std::__cxx11::string::reserve((ulong)in_RDI);
  local_28 = 0;
  while( true ) {
    iVar4 = local_28;
    iVar1 = BitMatrix::height(local_10);
    if (iVar1 <= iVar4) break;
    if ((local_14 & 1) != 0) {
      std::__cxx11::string::operator+=((string *)in_RDI,'\"');
    }
    RVar3 = BitMatrix::row((BitMatrix *)CONCAT44(iVar1,iVar4),
                           (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    in_stack_ffffffffffffff68 = RVar3._begin;
    local_30 = &local_40;
    local_40 = RVar3;
    local_48 = Range<const_unsigned_char_*>::begin(local_30);
    puVar2 = Range<const_unsigned_char_*>::end(local_30);
    for (; local_48 != puVar2; local_48 = local_48 + 1) {
      if (*local_48 == '\0') {
        local_a1 = local_12;
      }
      else {
        local_a1 = local_11;
      }
      std::__cxx11::string::operator+=((string *)in_RDI,local_a1);
      if ((local_13 & 1) != 0) {
        std::__cxx11::string::operator+=((string *)in_RDI,' ');
      }
    }
    if ((local_14 & 1) != 0) {
      std::__cxx11::string::operator+=((string *)in_RDI,"\\n\"");
    }
    std::__cxx11::string::operator+=((string *)in_RDI,'\n');
    local_28 = local_28 + 1;
  }
  return in_RDI;
}

Assistant:

std::string ToString(const BitMatrix& matrix, char one, char zero, bool addSpace, bool printAsCString)
{
	std::string result;
	result.reserve((addSpace ? 2 : 1) * (matrix.width() * matrix.height()) + matrix.height());
	for (int y = 0; y < matrix.height(); ++y) {
		if (printAsCString)
			result += '"';
		for (auto bit : matrix.row(y)) {
			result += bit ? one : zero;
			if (addSpace)
				result += ' ';
		}
		if (printAsCString)
			result += "\\n\"";
		result += '\n';
	}
	return result;
}